

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O2

void test_gzio(char *fname,Byte *uncompr,uLong uncomprLen)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  undefined8 uVar8;
  FILE *pFVar9;
  char *pcVar10;
  size_t sStack_40;
  int err;
  
  sVar4 = strlen(hello);
  lVar5 = gzopen64(fname,"wb");
  if (lVar5 == 0) {
LAB_0010262a:
    pcVar10 = "gzopen error\n";
LAB_001026f8:
    sStack_40 = 0xd;
LAB_00102751:
    fwrite(pcVar10,sStack_40,1,_stderr);
  }
  else {
    gzputc(lVar5,0x68);
    iVar2 = gzputs(lVar5,"ello");
    pFVar9 = _stderr;
    if (iVar2 == 4) {
      iVar2 = gzprintf(lVar5,", %s!","hello");
      pFVar9 = _stderr;
      if (iVar2 == 8) {
        gzseek64(lVar5,1,1);
        gzclose(lVar5);
        piVar6 = (int *)gzopen64(fname,"rb");
        if (piVar6 == (int *)0x0) goto LAB_0010262a;
        builtin_memcpy(uncompr,"garbage",8);
        iVar2 = gzread(piVar6,uncompr,uncomprLen & 0xffffffff);
        pFVar9 = _stderr;
        if (iVar2 == (int)sVar4 + 1) {
          iVar2 = strcmp((char *)uncompr,hello);
          if (iVar2 == 0) {
            printf("gzread(): %s\n",uncompr);
            lVar5 = gzseek64(piVar6,0xfffffffffffffff8,1);
            if ((lVar5 != 6) || (lVar7 = gztell64(piVar6), lVar7 != 6)) {
              pFVar9 = _stderr;
              uVar8 = gztell64(piVar6);
              fprintf(pFVar9,"gzseek error, pos=%ld, gztell=%ld\n",lVar5,uVar8);
              goto LAB_0010275a;
            }
            if (*piVar6 == 0) {
              uVar3 = gzgetc(piVar6);
            }
            else {
              *piVar6 = *piVar6 + -1;
              *(long *)(piVar6 + 4) = *(long *)(piVar6 + 4) + 1;
              pbVar1 = *(byte **)(piVar6 + 2);
              *(byte **)(piVar6 + 2) = pbVar1 + 1;
              uVar3 = (uint)*pbVar1;
            }
            if (uVar3 != 0x20) {
              pcVar10 = "gzgetc error\n";
              goto LAB_001026f8;
            }
            iVar2 = gzungetc(0x20,piVar6);
            if (iVar2 == 0x20) {
              gzgets(piVar6,uncompr,uncomprLen & 0xffffffff);
              sVar4 = strlen((char *)uncompr);
              pFVar9 = _stderr;
              if (sVar4 != 7) {
                uncompr = (Byte *)gzerror(piVar6,&err);
                pcVar10 = "gzgets err after gzseek: %s\n";
                goto LAB_00102735;
              }
              iVar2 = strcmp((char *)uncompr,hello + 6);
              if (iVar2 == 0) {
                printf("gzgets() after gzseek: %s\n",uncompr);
                gzclose(piVar6);
                return;
              }
              pcVar10 = "bad gzgets after gzseek\n";
              sStack_40 = 0x18;
            }
            else {
              pcVar10 = "gzungetc error\n";
              sStack_40 = 0xf;
            }
            goto LAB_00102751;
          }
          pcVar10 = "bad gzread: %s\n";
          pFVar9 = _stderr;
        }
        else {
          uncompr = (Byte *)gzerror(piVar6,&err);
          pcVar10 = "gzread err: %s\n";
        }
      }
      else {
        uncompr = (Byte *)gzerror(lVar5,&err);
        pcVar10 = "gzprintf err: %s\n";
      }
    }
    else {
      uncompr = (Byte *)gzerror(lVar5,&err);
      pcVar10 = "gzputs err: %s\n";
    }
LAB_00102735:
    fprintf(pFVar9,pcVar10,uncompr);
  }
LAB_0010275a:
  exit(1);
}

Assistant:

void test_gzio(fname, uncompr, uncomprLen)
    const char *fname; /* compressed file name */
    Byte *uncompr;
    uLong uncomprLen;
{
#ifdef NO_GZCOMPRESS
    fprintf(stderr, "NO_GZCOMPRESS -- gz* functions cannot compress\n");
#else
    int err;
    int len = (int)strlen(hello)+1;
    gzFile file;
    z_off_t pos;

    file = gzopen(fname, "wb");
    if (file == NULL) {
        fprintf(stderr, "gzopen error\n");
        exit(1);
    }
    gzputc(file, 'h');
    if (gzputs(file, "ello") != 4) {
        fprintf(stderr, "gzputs err: %s\n", gzerror(file, &err));
        exit(1);
    }
    if (gzprintf(file, ", %s!", "hello") != 8) {
        fprintf(stderr, "gzprintf err: %s\n", gzerror(file, &err));
        exit(1);
    }
    gzseek(file, 1L, SEEK_CUR); /* add one zero byte */
    gzclose(file);

    file = gzopen(fname, "rb");
    if (file == NULL) {
        fprintf(stderr, "gzopen error\n");
        exit(1);
    }
    strcpy((char*)uncompr, "garbage");

    if (gzread(file, uncompr, (unsigned)uncomprLen) != len) {
        fprintf(stderr, "gzread err: %s\n", gzerror(file, &err));
        exit(1);
    }
    if (strcmp((char*)uncompr, hello)) {
        fprintf(stderr, "bad gzread: %s\n", (char*)uncompr);
        exit(1);
    } else {
        printf("gzread(): %s\n", (char*)uncompr);
    }

    pos = gzseek(file, -8L, SEEK_CUR);
    if (pos != 6 || gztell(file) != pos) {
        fprintf(stderr, "gzseek error, pos=%ld, gztell=%ld\n",
                (long)pos, (long)gztell(file));
        exit(1);
    }

    if (gzgetc(file) != ' ') {
        fprintf(stderr, "gzgetc error\n");
        exit(1);
    }

    if (gzungetc(' ', file) != ' ') {
        fprintf(stderr, "gzungetc error\n");
        exit(1);
    }

    gzgets(file, (char*)uncompr, (int)uncomprLen);
    if (strlen((char*)uncompr) != 7) { /* " hello!" */
        fprintf(stderr, "gzgets err after gzseek: %s\n", gzerror(file, &err));
        exit(1);
    }
    if (strcmp((char*)uncompr, hello + 6)) {
        fprintf(stderr, "bad gzgets after gzseek\n");
        exit(1);
    } else {
        printf("gzgets() after gzseek: %s\n", (char*)uncompr);
    }

    gzclose(file);
#endif
}